

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexDecomposition.cpp
# Opt level: O2

void ConvexDecomposition::calcConvexDecomposition
               (uint vcount,float *vertices,uint tcount,uint *indices,
               ConvexDecompInterface *callback,float masterVolume,uint depth)

{
  float masterVolume_00;
  VertexLookup vlook;
  ConvexDecompInterface *callback_00;
  PlaneTriResult PVar1;
  HullError HVar2;
  uint uVar3;
  float *pfVar4;
  Vector3d *p2;
  HullResult *pHVar5;
  UintVector *list;
  VertexLookup pvVar6;
  Vector3d *p3;
  undefined4 in_register_0000008c;
  bool bVar7;
  float fVar8;
  uint bcount;
  uint fcount;
  VertexLookup local_1c0;
  VertexLookup local_1b8;
  undefined8 local_1b0;
  UintVector ifront;
  UintVector iback;
  HullResult result;
  Vector3d local_134;
  ConvexDecompInterface *local_120;
  float plane [4];
  Vector3d front [4];
  float volume;
  
  local_1b0 = CONCAT44(in_register_0000008c,depth);
  if (depth < MAXDEPTH) {
    fVar8 = computeConcavity(vcount,vertices,tcount,indices,callback,plane,&volume);
    uVar3 = (uint)local_1b0;
    if ((uVar3 < MAXDEPTH) &&
       (masterVolume_00 =
             (float)((uint)(uVar3 == 0) * (int)volume + (uint)(uVar3 != 0) * (int)masterVolume),
       CONCAVE_PERCENT < (fVar8 * 100.0) / masterVolume_00)) {
      ifront.m_ownsMemory = true;
      ifront.m_data = (uint *)0x0;
      iback.m_ownsMemory = true;
      iback.m_data = (uint *)0x0;
      ifront.m_size = 0;
      ifront.m_capacity = 0;
      iback.m_size = 0;
      iback.m_capacity = 0;
      local_1c0 = Vl_createVertexLookup();
      local_120 = callback;
      local_1b8 = Vl_createVertexLookup();
      do {
        callback_00 = local_120;
        vlook = local_1b8;
        pvVar6 = local_1c0;
        bVar7 = tcount == 0;
        tcount = tcount - 1;
        if (bVar7) {
          if (ifront.m_size != 0) {
            uVar3 = Vl_getVcount(local_1c0);
            pfVar4 = Vl_getVertices(pvVar6);
            calcConvexDecomposition
                      (uVar3,pfVar4,ifront.m_size / 3,ifront.m_data,callback_00,masterVolume_00,
                       (int)local_1b0 + 1);
          }
          cbtAlignedObjectArray<unsigned_int>::clear(&ifront);
          Vl_releaseVertexLookup(pvVar6);
          if (iback.m_size != 0) {
            uVar3 = Vl_getVcount(vlook);
            pfVar4 = Vl_getVertices(vlook);
            calcConvexDecomposition
                      (uVar3,pfVar4,iback.m_size / 3,iback.m_data,callback_00,masterVolume_00,
                       (int)local_1b0 + 1);
          }
          cbtAlignedObjectArray<unsigned_int>::clear(&iback);
          Vl_releaseVertexLookup(vlook);
          cbtAlignedObjectArray<unsigned_int>::~cbtAlignedObjectArray(&iback);
          cbtAlignedObjectArray<unsigned_int>::~cbtAlignedObjectArray(&ifront);
          return;
        }
        FaceTri::FaceTri((FaceTri *)&volume,vertices,*indices,indices[1],indices[2]);
        fcount = 0;
        bcount = 0;
        PVar1 = planeTriIntersection
                          (plane,&volume,0xc,1e-05,(float *)front,&fcount,(float *)&result,&bcount);
        if ((4 < fcount) || (4 < bcount)) {
          PVar1 = planeTriIntersection
                            (plane,&volume,0xc,1e-05,(float *)front,&fcount,(float *)&result,&bcount
                            );
        }
        pHVar5 = &result;
        if (PVar1 == PTR_SPLIT) {
          if (1 < fcount - 3) {
            __assert_fail("fcount >= 3 && fcount <= 4",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/ConvexDecomposition.cpp"
                          ,0x12d,
                          "void ConvexDecomposition::calcConvexDecomposition(unsigned int, const float *, unsigned int, const unsigned int *, ConvexDecompInterface *, float, unsigned int)"
                         );
          }
          if (1 < bcount - 3) {
            __assert_fail("bcount >= 3 && bcount <= 4",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/ConvexDecomposition.cpp"
                          ,0x12e,
                          "void ConvexDecomposition::calcConvexDecomposition(unsigned int, const float *, unsigned int, const unsigned int *, ConvexDecompInterface *, float, unsigned int)"
                         );
          }
          addTri(local_1c0,&ifront,front,front + 1,front + 2);
          addTri(local_1b8,&iback,(Vector3d *)&result,
                 (Vector3d *)((long)&result.mOutputVertices + 4),(Vector3d *)&result.mIndices);
          if (fcount == 4) {
            addTri(local_1c0,&ifront,front,front + 2,front + 3);
          }
          list = &iback;
          p2 = (Vector3d *)&result.mIndices;
          p3 = &local_134;
          pvVar6 = local_1b8;
          if (bcount == 4) goto LAB_00e2fa6c;
        }
        else {
          if (PVar1 == PTR_BACK) {
            list = &iback;
            p2 = (Vector3d *)((long)&result.mOutputVertices + 4);
            p3 = (Vector3d *)&result.mIndices;
            pvVar6 = local_1b8;
            if (bcount != 3) {
              __assert_fail("bcount == 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/ConvexDecomposition.cpp"
                            ,0x11f,
                            "void ConvexDecomposition::calcConvexDecomposition(unsigned int, const float *, unsigned int, const unsigned int *, ConvexDecompInterface *, float, unsigned int)"
                           );
            }
          }
          else {
            if (PVar1 != PTR_FRONT) goto LAB_00e2fa71;
            list = &ifront;
            p2 = front + 1;
            p3 = front + 2;
            pHVar5 = (HullResult *)front;
            pvVar6 = local_1c0;
            if (fcount != 3) {
              __assert_fail("fcount == 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/ConvexDecomposition.cpp"
                            ,0x111,
                            "void ConvexDecomposition::calcConvexDecomposition(unsigned int, const float *, unsigned int, const unsigned int *, ConvexDecompInterface *, float, unsigned int)"
                           );
            }
          }
LAB_00e2fa6c:
          addTri(pvVar6,list,(Vector3d *)pHVar5,p2,p3);
        }
LAB_00e2fa71:
        indices = indices + 3;
      } while( true );
    }
  }
  result.mPolygons = true;
  result.mNumOutputVertices = 0;
  result.mOutputVertices._0_4_ = 0;
  result.mOutputVertices._4_4_ = 0;
  front[2].y = 5.73972e-42;
  front[2].z = 5.73972e-42;
  result.mNumFaces = 0;
  result.mNumIndices = 0;
  result.mIndices = (uint *)0x0;
  front[1].z = 0.001;
  front[2].x = 0.01;
  front[0].x = 1.4013e-45;
  front[1].y = 1.68156e-44;
  front[0].y = (float)vcount;
  front._8_8_ = vertices;
  HVar2 = HullLibrary::CreateConvexHull((HullLibrary *)&ifront,(HullDesc *)front,&result);
  if (HVar2 == QE_OK) {
    ConvexResult::ConvexResult
              ((ConvexResult *)&volume,result.mNumOutputVertices,
               (float *)CONCAT44(result.mOutputVertices._4_4_,result.mOutputVertices._0_4_),
               result.mNumFaces,result.mIndices);
    (*callback->_vptr_ConvexDecompInterface[6])(callback,(ConvexResult *)&volume);
    ConvexResult::~ConvexResult((ConvexResult *)&volume);
  }
  HullLibrary::ReleaseResult((HullLibrary *)&ifront,&result);
  return;
}

Assistant:

void calcConvexDecomposition(unsigned int           vcount,
                                const float           *vertices,
                                unsigned int           tcount,
                                const unsigned int    *indices,
                                ConvexDecompInterface *callback,
                                float                  masterVolume,
                                unsigned int           depth)

{

  float plane[4];

  bool split = false;


  if ( depth < MAXDEPTH )
  {

		float volume;
		float c = computeConcavity( vcount, vertices, tcount, indices, callback, plane, volume );

    if ( depth == 0 )
    {
      masterVolume = volume;
    }

		float percent = (c*100.0f)/masterVolume;

		if ( percent > CONCAVE_PERCENT ) // if great than 5% of the total volume is concave, go ahead and keep splitting.
		{
      split = true;
    }

  }

  if ( depth >= MAXDEPTH || !split )
  {

#if 1

    HullResult result;
    HullLibrary hl;
    HullDesc   desc;

  	desc.SetHullFlag(QF_TRIANGLES);

    desc.mVcount       = vcount;
    desc.mVertices     = vertices;
    desc.mVertexStride = sizeof(float)*3;

    HullError ret = hl.CreateConvexHull(desc,result);

    if ( ret == QE_OK )
    {

			ConvexResult r(result.mNumOutputVertices, result.mOutputVertices, result.mNumFaces, result.mIndices);


			callback->ConvexDecompResult(r);
    }


#else

		static unsigned int colors[8] =
		{
			0xFF0000,
		  0x00FF00,
			0x0000FF,
			0xFFFF00,
			0x00FFFF,
			0xFF00FF,
			0xFFFFFF,
			0xFF8040
		};

		static int count = 0;

		count++;

		if ( count == 8 ) count = 0;

		assert( count >= 0 && count < 8 );

		unsigned int color = colors[count];

    const unsigned int *source = indices;

    for (unsigned int i=0; i<tcount; i++)
    {

      unsigned int i1 = *source++;
      unsigned int i2 = *source++;
      unsigned int i3 = *source++;

			FaceTri t(vertices, i1, i2, i3 );

      callback->ConvexDebugTri( t.mP1.Ptr(), t.mP2.Ptr(), t.mP3.Ptr(), color );

    }
#endif

    hl.ReleaseResult (result);
    return;

  }

  UintVector ifront;
  UintVector iback;

  VertexLookup vfront = Vl_createVertexLookup();
  VertexLookup vback  = Vl_createVertexLookup();


	bool showmesh = false;
  #if SHOW_MESH
  showmesh = true;
  #endif

	if ( 0 )
	{
		showmesh = true;
	  for (float x=-1; x<1; x+=0.10f)
		{
		  for (float y=0; y<1; y+=0.10f)
			{
			  for (float z=-1; z<1; z+=0.04f)
				{
				  float d = x*plane[0] + y*plane[1] + z*plane[2] + plane[3];
					Vector3d p(x,y,z);
				  if ( d >= 0 )
					  callback->ConvexDebugPoint(p.Ptr(), 0.02f, 0x00FF00);
				  else
					  callback->ConvexDebugPoint(p.Ptr(), 0.02f, 0xFF0000);
				}
			}
		}
	}

	if ( 1 )
	{
		// ok..now we are going to 'split' all of the input triangles against this plane!
		const unsigned int *source = indices;
		for (unsigned int i=0; i<tcount; i++)
		{
			unsigned int i1 = *source++;
			unsigned int i2 = *source++;
			unsigned int i3 = *source++;

			FaceTri t(vertices, i1, i2, i3 );

			Vector3d front[4];
			Vector3d back[4];

			unsigned int fcount=0;
			unsigned int bcount=0;

			PlaneTriResult result;

		  result = planeTriIntersection(plane,t.mP1.Ptr(),sizeof(Vector3d),0.00001f,front[0].Ptr(),fcount,back[0].Ptr(),bcount );

			if( fcount > 4 || bcount > 4 )
			{
		    result = planeTriIntersection(plane,t.mP1.Ptr(),sizeof(Vector3d),0.00001f,front[0].Ptr(),fcount,back[0].Ptr(),bcount );
			}

			switch ( result )
			{
				case PTR_FRONT:

					assert( fcount == 3 );

          if ( showmesh )
            callback->ConvexDebugTri( front[0].Ptr(), front[1].Ptr(), front[2].Ptr(), 0x00FF00 );

          #if MAKE_MESH

          addTri( vfront, ifront, front[0], front[1], front[2] );


          #endif

					break;
				case PTR_BACK:
					assert( bcount == 3 );

          if ( showmesh )
  					callback->ConvexDebugTri( back[0].Ptr(), back[1].Ptr(), back[2].Ptr(), 0xFFFF00 );

          #if MAKE_MESH

          addTri( vback, iback, back[0], back[1], back[2] );

          #endif

					break;
				case PTR_SPLIT:

					assert( fcount >= 3 && fcount <= 4);
					assert( bcount >= 3 && bcount <= 4);

          #if MAKE_MESH

          addTri( vfront, ifront, front[0], front[1], front[2] );
          addTri( vback, iback, back[0], back[1], back[2] );


          if ( fcount == 4 )
          {
            addTri( vfront, ifront, front[0], front[2], front[3] );
          }

          if ( bcount == 4  )
          {
            addTri( vback, iback, back[0], back[2], back[3] );
          }

          #endif

          if ( showmesh )
          {
  					callback->ConvexDebugTri( front[0].Ptr(), front[1].Ptr(), front[2].Ptr(), 0x00D000 );
  					callback->ConvexDebugTri( back[0].Ptr(), back[1].Ptr(), back[2].Ptr(), 0xD0D000 );

  					if ( fcount == 4 )
  					{
  						callback->ConvexDebugTri( front[0].Ptr(), front[2].Ptr(), front[3].Ptr(), 0x00D000 );
  					}
  					if ( bcount == 4 )
  					{
  						callback->ConvexDebugTri( back[0].Ptr(), back[2].Ptr(), back[3].Ptr(), 0xD0D000 );
  					}
  				}

					break;
			}
		}

    // ok... here we recursively call
    if ( ifront.size() )
    {
      unsigned int vcount   = Vl_getVcount(vfront);
      const float *vertices = Vl_getVertices(vfront);
      unsigned int tcount   = ifront.size()/3;

      calcConvexDecomposition(vcount, vertices, tcount, &ifront[0], callback, masterVolume, depth+1);

    }

    ifront.clear();

    Vl_releaseVertexLookup(vfront);

    if ( iback.size() )
    {
      unsigned int vcount   = Vl_getVcount(vback);
      const float *vertices = Vl_getVertices(vback);
      unsigned int tcount   = iback.size()/3;

      calcConvexDecomposition(vcount, vertices, tcount, &iback[0], callback, masterVolume, depth+1);

    }

    iback.clear();
    Vl_releaseVertexLookup(vback);

	}
}